

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::applyTranspositionOnTheRight
          (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this,Index i,Index j)

{
  bool bVar1;
  Index IVar2;
  PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  Scalar *__b;
  PermutationMatrix<_1,__1,_int> *pPVar3;
  int in_EDX;
  int in_ESI;
  EigenBase<Eigen::PermutationMatrix<_1,__1,_int>_> *in_RDI;
  Index in_stack_ffffffffffffffc8;
  PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = false;
  if ((-1 < in_ESI) && (bVar1 = false, -1 < in_EDX)) {
    IVar2 = size((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)0x2db6f7);
    bVar1 = false;
    if (in_ESI < IVar2) {
      IVar2 = size((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)0x2db719);
      bVar1 = in_EDX < IVar2;
    }
  }
  if (!bVar1) {
    __assert_fail("i>=0 && j>=0 && i<size() && j<size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/PermutationMatrix.h"
                  ,0xc0,
                  "Derived &Eigen::PermutationBase<Eigen::PermutationMatrix<-1, -1>>::applyTranspositionOnTheRight(Index, Index) [Derived = Eigen::PermutationMatrix<-1, -1>]"
                 );
  }
  indices((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)0x2db75d);
  this_00 = (PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
            PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeffRef
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  indices((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)0x2db779);
  __b = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeffRef
                  (this_00,in_stack_ffffffffffffffc8);
  std::swap<int>((int *)this_00,__b);
  pPVar3 = EigenBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::derived(in_RDI);
  return pPVar3;
}

Assistant:

Derived& applyTranspositionOnTheRight(Index i, Index j)
    {
      eigen_assert(i>=0 && j>=0 && i<size() && j<size());
      std::swap(indices().coeffRef(i), indices().coeffRef(j));
      return derived();
    }